

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyTable.cpp
# Opt level: O1

Var Js::WebAssemblyTable::EntrySet(RecyclableObject *function,CallInfo callInfo,...)

{
  WriteBarrierPtr<void> *addr;
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  uint32 uVar5;
  undefined4 *puVar6;
  Var pvVar7;
  WebAssemblyTable *pWVar8;
  Var instance;
  Var aValue;
  int32 hCode;
  int in_stack_00000010;
  CallInfo local_40;
  CallInfo callInfo_local;
  ArgumentReader args;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_40 = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != local_40._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyTable.cpp"
                                ,0xa1,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00da3222;
    *puVar6 = 0;
  }
  callInfo_local = local_40;
  ArgumentReader::AdjustArguments((ArgumentReader *)&callInfo_local,&local_40);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)local_40 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyTable.cpp"
                                ,0xa4,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
LAB_00da3222:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  if (((ulong)callInfo_local & 0xffffff) != 0) {
    pvVar7 = Arguments::operator[]((Arguments *)&callInfo_local,0);
    bVar3 = VarIs<Js::WebAssemblyTable>(pvVar7);
    if (bVar3) {
      pvVar7 = Arguments::operator[]((Arguments *)&callInfo_local,0);
      pWVar8 = VarTo<Js::WebAssemblyTable>(pvVar7);
      if (2 < (callInfo_local._0_4_ & 0xffffff)) {
        pvVar7 = Arguments::operator[]((Arguments *)&callInfo_local,1);
        instance = Arguments::operator[]((Arguments *)&callInfo_local,2);
        BVar4 = JavascriptOperators::IsNull(instance);
        if (BVar4 != 0) {
          instance = (void *)0x0;
LAB_00da31c3:
          uVar5 = WebAssembly::ToNonWrappingUint32(pvVar7,pSVar1);
          if (uVar5 < pWVar8->m_currentLength) {
            addr = (pWVar8->m_values).ptr + uVar5;
            Memory::Recycler::WBSetBit((char *)addr);
            addr->ptr = instance;
            Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
            return (((pSVar1->super_ScriptContextBase).javascriptLibrary)->
                   super_JavascriptLibraryBase).undefinedValue.ptr;
          }
          JavascriptError::ThrowRangeError(pSVar1,-0x7ff5ebf6,(PCWSTR)0x0);
        }
        aValue = Arguments::operator[]((Arguments *)&callInfo_local,2);
        bVar3 = VarIs<Js::WasmScriptFunction>(aValue);
        if (bVar3) goto LAB_00da31c3;
      }
      hCode = -0x7ff5e49b;
      goto LAB_00da321b;
    }
  }
  hCode = -0x7ff5e49c;
LAB_00da321b:
  JavascriptError::ThrowTypeError(pSVar1,hCode,(PCWSTR)0x0);
}

Assistant:

Var
WebAssemblyTable::EntrySet(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();

    Assert(!(callInfo.Flags & CallFlags_New));

    if (args.Info.Count == 0 || !VarIs<WebAssemblyTable>(args[0]))
    {
        JavascriptError::ThrowTypeError(scriptContext, WASMERR_NeedTableObject);
    }
    WebAssemblyTable * table = VarTo<WebAssemblyTable>(args[0]);

    if (args.Info.Count < 3)
    {
        JavascriptError::ThrowTypeError(scriptContext, WASMERR_NeedWebAssemblyFunc);
    }
    Var indexVar = args[1];
    Var value = args[2];

    if (JavascriptOperators::IsNull(value))
    {
        value = nullptr;
    }
    else if (!VarIs<WasmScriptFunction>(args[2]))
    {
        JavascriptError::ThrowTypeError(scriptContext, WASMERR_NeedWebAssemblyFunc);
    }

    uint32 index = WebAssembly::ToNonWrappingUint32(indexVar, scriptContext);
    if (index >= table->m_currentLength)
    {
        JavascriptError::ThrowRangeError(scriptContext, JSERR_ArgumentOutOfRange);
    }

    table->m_values[index] = value;

    return scriptContext->GetLibrary()->GetUndefined();
}